

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cc
# Opt level: O2

void __thiscall PoolTest_Pooled_Test::TestBody(PoolTest_Pooled_Test *this)

{
  __uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true> _Var1;
  CRYPTO_BUFFER *__p;
  char *pcVar2;
  char *in_R9;
  UniquePtr<CRYPTO_BUFFER> buf7;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  UniquePtr<CRYPTO_BUFFER> buf4;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  UniquePtr<CRYPTO_BUFFER> buf3;
  UniquePtr<CRYPTO_BUFFER> buf5;
  UniquePtr<CRYPTO_BUFFER> buf;
  UniquePtr<CRYPTO_BUFFER> buf6;
  UniquePtr<CRYPTO_BUFFER_POOL> pool;
  UniquePtr<CRYPTO_BUFFER> buf2;
  AssertHelper local_18;
  
  pool._M_t.super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_pool_st,_bssl::internal::Deleter,_true,_true>)
       CRYPTO_BUFFER_POOL_new();
  local_88._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl._0_1_ =
       (tuple<crypto_buffer_pool_st_*,_bssl::internal::Deleter>)
       pool._M_t.super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_crypto_buffer_pool_st_*,_false>)0x0;
  if ((tuple<crypto_buffer_pool_st_*,_bssl::internal::Deleter>)
      pool._M_t.super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_crypto_buffer_pool_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&buf4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&buf7,(AssertionResult *)0x525a57,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&buf,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
               ,0x43,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&buf,(Message *)&buf4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
        buf4._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)buf4._M_t.
                            super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
    goto LAB_00304dd9;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
  buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       CRYPTO_BUFFER_new("\x01\x02\x03\x04",4,
                         (CRYPTO_BUFFER_POOL *)
                         pool._M_t.
                         super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl);
  local_88._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl._0_1_ =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0;
  if ((tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
      buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&buf4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&buf7,(AssertionResult *)0x4d9bb1,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&buf2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
               ,0x48,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&buf2,(Message *)&buf4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf2);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
        buf4._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)buf4._M_t.
                            super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
    buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)TestBody::kData1;
    local_88._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x4;
    _Var1.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
         (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
         CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                            buf._M_t.
                            super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
    CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                      buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t
                      .super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
    buf4._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
         _Var1.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)&gtest_ar,"Bytes(kData1)",
               "Bytes(CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get()))",(Bytes *)&buf7,
               (Bytes *)&buf4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&buf7);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&buf4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                 ,0x4a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&buf4,(Message *)&buf7);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf4);
      if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
          buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)buf7._M_t.
                              super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    buf2._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
         CRYPTO_BUFFER_new("\x01\x02\x03\x04",4,
                           (CRYPTO_BUFFER_POOL *)
                           pool._M_t.
                           super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>.
                           _M_t.
                           super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl);
    local_88._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl._0_1_ =
         (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
         buf2._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0;
    if ((tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
        buf2._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&buf4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&buf7,(AssertionResult *)"buf2","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&buf3,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                 ,0x4e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&buf3,(Message *)&buf4);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf3);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
          buf4._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)buf4._M_t.
                              super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88);
      buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)TestBody::kData1;
      local_88._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x4;
      _Var1.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
           (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
           CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                              buf2._M_t.
                              super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
      CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                        buf2._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
      buf4._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
           _Var1.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&gtest_ar,"Bytes(kData1)",
                 "Bytes(CRYPTO_BUFFER_data(buf2.get()), CRYPTO_BUFFER_len(buf2.get()))",
                 (Bytes *)&buf7,(Bytes *)&buf4);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&buf7);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&buf4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                   ,0x50,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&buf4,(Message *)&buf7);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf4);
        if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
            buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)buf7._M_t.
                                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8))
                    ();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      buf7 = buf;
      buf4 = buf2;
      testing::internal::CmpHelperEQ<crypto_buffer_st*,crypto_buffer_st*>
                ((internal *)&gtest_ar,"buf.get()","buf2.get()",(crypto_buffer_st **)&buf7,
                 (crypto_buffer_st **)&buf4);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&buf7);
        std::operator<<((ostream *)
                        ((long)buf7._M_t.
                               super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 0x10)
                        ,"CRYPTO_BUFFER_POOL did not dedup data.");
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&buf4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                   ,0x52,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&buf4,(Message *)&buf7);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf4);
        if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
            buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)buf7._M_t.
                                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8))
                    ();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      buf3._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
           CRYPTO_BUFFER_new("\x05\x06\a\b",4,
                             (CRYPTO_BUFFER_POOL *)
                             pool._M_t.
                             super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>.
                             _M_t.
                             super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>
                             .super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl);
      local_88._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl._0_1_ =
           (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
           buf3._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0;
      if ((tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
          buf3._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&buf4);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&buf7,(AssertionResult *)"buf3","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&buf5,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                   ,0x58,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&buf5,(Message *)&buf4);
LAB_003046d4:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf5);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
            buf4._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)buf4._M_t.
                                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8))
                    ();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_88);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_88);
        buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             TestBody::kData2;
        local_88._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x4;
        _Var1.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
             CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                buf3._M_t.
                                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
        CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                          buf3._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                          ._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
        buf4._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             _Var1.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)&gtest_ar,"Bytes(kData2)",
                   "Bytes(CRYPTO_BUFFER_data(buf3.get()), CRYPTO_BUFFER_len(buf3.get()))",
                   (Bytes *)&buf7,(Bytes *)&buf4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&buf7);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf4,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x5a,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf4,(Message *)&buf7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf4);
          if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
              buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)buf7._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8
                        ))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        buf7 = buf;
        buf4 = buf3;
        testing::internal::CmpHelperNE<crypto_buffer_st*,crypto_buffer_st*>
                  ((internal *)&gtest_ar,"buf.get()","buf3.get()",(crypto_buffer_st **)&buf7,
                   (crypto_buffer_st **)&buf4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&buf7);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf4,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x5b,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf4,(Message *)&buf7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf4);
          if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
              buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)buf7._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8
                        ))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)&buf3,(pointer)0x0)
        ;
        buf4._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl._0_4_ = 1;
        buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             OPENSSL_lh_num_items
                       (*(_LHASH **)
                         pool._M_t.
                         super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&gtest_ar,"1u","lh_CRYPTO_BUFFER_num_items(pool->bufs)",(uint *)&buf4
                   ,(unsigned_long *)&buf7);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&buf7);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf4,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x5f,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf4,(Message *)&buf7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf4);
          if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
              buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)buf7._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8
                        ))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        __p = CRYPTO_BUFFER_new_from_static_data_unsafe
                        ("\x05\x06\a\b",4,
                         (CRYPTO_BUFFER_POOL *)
                         pool._M_t.
                         super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl);
        std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)&buf3,__p);
        local_88._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl._0_1_ =
             (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
             buf3._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
            buf3._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&buf4);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&buf7,(AssertionResult *)"buf3","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf5,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,100,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf5,(Message *)&buf4);
          goto LAB_003046d4;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_88);
        buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                buf3._M_t.
                                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
        testing::internal::CmpHelperEQ<unsigned_char[4],unsigned_char_const*>
                  ((internal *)&gtest_ar,"kData2","CRYPTO_BUFFER_data(buf3.get())",
                   (uchar (*) [4])"\x05\x06\a\b",(uchar **)&buf7);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&buf7);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf4,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x65,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf4,(Message *)&buf7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf4);
          if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
              buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)buf7._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8
                        ))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x4;
        buf4._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                               buf3._M_t.
                               super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"sizeof(kData2)","CRYPTO_BUFFER_len(buf3.get())",
                   (unsigned_long *)&buf7,(unsigned_long *)&buf4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&buf7);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf4,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x66,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf4,(Message *)&buf7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf4);
          if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
              buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)buf7._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8
                        ))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        buf7 = buf;
        buf4 = buf3;
        testing::internal::CmpHelperNE<crypto_buffer_st*,crypto_buffer_st*>
                  ((internal *)&gtest_ar,"buf.get()","buf3.get()",(crypto_buffer_st **)&buf7,
                   (crypto_buffer_st **)&buf4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&buf7);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf4,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x67,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf4,(Message *)&buf7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf4);
          if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
              buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)buf7._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8
                        ))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             CRYPTO_BUFFER_new("\x05\x06\a\b",4,
                               (CRYPTO_BUFFER_POOL *)
                               pool._M_t.
                               super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>
                               .super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl);
        buf5 = buf3;
        buf4._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
        testing::internal::CmpHelperEQ<crypto_buffer_st*,crypto_buffer_st*>
                  ((internal *)&gtest_ar,"buf4.get()","buf3.get()",(crypto_buffer_st **)&buf7,
                   (crypto_buffer_st **)&buf5);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&buf7);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf5,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x6b,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf5,(Message *)&buf7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf5);
          if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
              buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)buf7._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8
                        ))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             CRYPTO_BUFFER_new_from_static_data_unsafe
                       ("\x05\x06\a\b",4,
                        (CRYPTO_BUFFER_POOL *)
                        pool._M_t.
                        super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl);
        buf6 = buf3;
        buf5._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
        testing::internal::CmpHelperEQ<crypto_buffer_st*,crypto_buffer_st*>
                  ((internal *)&gtest_ar,"buf5.get()","buf3.get()",(crypto_buffer_st **)&buf7,
                   (crypto_buffer_st **)&buf6);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&buf7);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf6,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x6f,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf6,(Message *)&buf7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf6);
          if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
              buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)buf7._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8
                        ))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        buf6._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             CRYPTO_BUFFER_new_from_static_data_unsafe
                       ("\x01\x02\x03\x04",4,
                        (CRYPTO_BUFFER_POOL *)
                        pool._M_t.
                        super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl);
        local_88._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl._0_1_ =
             (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
             buf6._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
             (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0;
        if ((tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
            buf6._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&buf7,(AssertionResult *)"buf6","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_18,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x75,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_18);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((CRYPTO_BUFFER *)local_50._M_head_impl != (CRYPTO_BUFFER *)0x0) {
            (**(code **)(*(long *)local_50._M_head_impl + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_88);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_88);
          buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
               CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                  buf6._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
          testing::internal::CmpHelperEQ<unsigned_char[4],unsigned_char_const*>
                    ((internal *)&gtest_ar,"kData1","CRYPTO_BUFFER_data(buf6.get())",
                     (uchar (*) [4])"\x01\x02\x03\x04",(uchar **)&buf7);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&buf7);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x76,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&buf7);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
            if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
                buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)buf7._M_t.
                                    super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl +
                          8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x4;
          local_50._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                                 buf6._M_t.
                                 super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)&gtest_ar,"sizeof(kData1)","CRYPTO_BUFFER_len(buf6.get())",
                     (unsigned_long *)&buf7,(unsigned_long *)&local_50);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&buf7);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x77,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&buf7);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
            if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
                buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)buf7._M_t.
                                    super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl +
                          8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          buf7 = buf;
          local_50._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               buf6._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
          testing::internal::CmpHelperNE<crypto_buffer_st*,crypto_buffer_st*>
                    ((internal *)&gtest_ar,"buf.get()","buf6.get()",(crypto_buffer_st **)&buf7,
                     (crypto_buffer_st **)&local_50);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&buf7);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x78,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&buf7);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
            if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
                buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)buf7._M_t.
                                    super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl +
                          8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
               CRYPTO_BUFFER_new("\x01\x02\x03\x04",4,
                                 (CRYPTO_BUFFER_POOL *)
                                 pool._M_t.
                                 super___uniq_ptr_impl<crypto_buffer_pool_st,_bssl::internal::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_crypto_buffer_pool_st_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_crypto_buffer_pool_st_*,_false>._M_head_impl
                                );
          local_18.data_ =
               (AssertHelperData *)
               buf6._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
          local_50._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               buf7._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
          testing::internal::CmpHelperEQ<crypto_buffer_st*,crypto_buffer_st*>
                    ((internal *)&gtest_ar,"buf7.get()","buf6.get()",(crypto_buffer_st **)&local_50,
                     (crypto_buffer_st **)&local_18);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_50);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_18,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x7d,pcVar2);
            testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper(&local_18);
            if ((CRYPTO_BUFFER *)local_50._M_head_impl != (CRYPTO_BUFFER *)0x0) {
              (**(code **)(*(long *)local_50._M_head_impl + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buf7);
        }
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buf6);
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buf5);
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buf4);
      }
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buf3);
    }
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buf2);
  }
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buf);
LAB_00304dd9:
  std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::~unique_ptr(&pool);
  return;
}

Assistant:

TEST(PoolTest, Pooled) {
  bssl::UniquePtr<CRYPTO_BUFFER_POOL> pool(CRYPTO_BUFFER_POOL_new());
  ASSERT_TRUE(pool);

  static const uint8_t kData1[4] = {1, 2, 3, 4};
  bssl::UniquePtr<CRYPTO_BUFFER> buf(
      CRYPTO_BUFFER_new(kData1, sizeof(kData1), pool.get()));
  ASSERT_TRUE(buf);
  EXPECT_EQ(Bytes(kData1),
            Bytes(CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get())));

  bssl::UniquePtr<CRYPTO_BUFFER> buf2(
      CRYPTO_BUFFER_new(kData1, sizeof(kData1), pool.get()));
  ASSERT_TRUE(buf2);
  EXPECT_EQ(Bytes(kData1), Bytes(CRYPTO_BUFFER_data(buf2.get()),
                                 CRYPTO_BUFFER_len(buf2.get())));

  EXPECT_EQ(buf.get(), buf2.get()) << "CRYPTO_BUFFER_POOL did not dedup data.";

  // Different inputs do not get deduped.
  static const uint8_t kData2[4] = {5, 6, 7, 8};
  bssl::UniquePtr<CRYPTO_BUFFER> buf3(
      CRYPTO_BUFFER_new(kData2, sizeof(kData2), pool.get()));
  ASSERT_TRUE(buf3);
  EXPECT_EQ(Bytes(kData2), Bytes(CRYPTO_BUFFER_data(buf3.get()),
                                 CRYPTO_BUFFER_len(buf3.get())));
  EXPECT_NE(buf.get(), buf3.get());

  // When the last refcount on |buf3| is dropped, it is removed from the pool.
  buf3 = nullptr;
  EXPECT_EQ(1u, lh_CRYPTO_BUFFER_num_items(pool->bufs));

  // Static buffers participate in pooling.
  buf3.reset(CRYPTO_BUFFER_new_from_static_data_unsafe(kData2, sizeof(kData2),
                                                       pool.get()));
  ASSERT_TRUE(buf3);
  EXPECT_EQ(kData2, CRYPTO_BUFFER_data(buf3.get()));
  EXPECT_EQ(sizeof(kData2), CRYPTO_BUFFER_len(buf3.get()));
  EXPECT_NE(buf.get(), buf3.get());

  bssl::UniquePtr<CRYPTO_BUFFER> buf4(
      CRYPTO_BUFFER_new(kData2, sizeof(kData2), pool.get()));
  EXPECT_EQ(buf4.get(), buf3.get());

  bssl::UniquePtr<CRYPTO_BUFFER> buf5(CRYPTO_BUFFER_new_from_static_data_unsafe(
      kData2, sizeof(kData2), pool.get()));
  EXPECT_EQ(buf5.get(), buf3.get());

  // When creating a static buffer, if there is already a non-static buffer, it
  // replaces the old buffer.
  bssl::UniquePtr<CRYPTO_BUFFER> buf6(CRYPTO_BUFFER_new_from_static_data_unsafe(
      kData1, sizeof(kData1), pool.get()));
  ASSERT_TRUE(buf6);
  EXPECT_EQ(kData1, CRYPTO_BUFFER_data(buf6.get()));
  EXPECT_EQ(sizeof(kData1), CRYPTO_BUFFER_len(buf6.get()));
  EXPECT_NE(buf.get(), buf6.get());

  // Subsequent lookups of |kData1| should return |buf6|.
  bssl::UniquePtr<CRYPTO_BUFFER> buf7(
      CRYPTO_BUFFER_new(kData1, sizeof(kData1), pool.get()));
  EXPECT_EQ(buf7.get(), buf6.get());
}